

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suite.c
# Opt level: O3

int count_tests(TestSuite *suite)

{
  int iVar1;
  UnitTest *pUVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  iVar1 = suite->size;
  if ((long)iVar1 < 1) {
    iVar4 = 0;
  }
  else {
    pUVar2 = suite->tests;
    lVar5 = 0;
    iVar4 = 0;
    do {
      if (*(int *)((long)&pUVar2->type + lVar5) == 0) {
        iVar4 = iVar4 + 1;
      }
      else {
        iVar3 = count_tests(*(TestSuite **)((long)&pUVar2->Runnable + lVar5));
        iVar4 = iVar4 + iVar3;
      }
      lVar5 = lVar5 + 0x18;
    } while ((long)iVar1 * 0x18 != lVar5);
  }
  return iVar4;
}

Assistant:

int count_tests(TestSuite *suite) {
    int count = 0;
    int i;
    for (i = 0; i < suite->size; i++) {
        if (suite->tests[i].type == test_function) {
            count++;
        } else {
            count += count_tests(suite->tests[i].Runnable.suite);
        }
    }
    return count;
}